

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_bitmap.c
# Opt level: O3

void ogl_draw_bitmap_region
               (ALLEGRO_BITMAP *bitmap,ALLEGRO_COLOR tint,float sx,float sy,float sw,float sh,
               int flags)

{
  int iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  _Bool _Var4;
  uint uVar5;
  ALLEGRO_BITMAP *bitmap_00;
  ALLEGRO_DISPLAY *pAVar6;
  ALLEGRO_TRANSFORM *pAVar7;
  float *x;
  ALLEGRO_BITMAP *bitmap_01;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar11;
  float fVar12;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM3_Db;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 in_XMM4_Db;
  float fVar17;
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 in_XMM5_Db;
  undefined4 in_XMM5_Dc;
  undefined4 in_XMM5_Dd;
  undefined1 in_XMM6 [16];
  undefined1 auVar19 [12];
  undefined1 auVar18 [16];
  float fVar20;
  float fVar21;
  ALLEGRO_COLOR tint_00;
  float ytrans;
  float xtrans;
  float dw;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float dh;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [16];
  undefined8 local_48;
  float *local_38;
  undefined1 auVar10 [16];
  
  auVar19 = in_XMM6._4_12_;
  local_48 = tint._0_8_;
  uStack_84 = in_XMM5_Db;
  dh = sh;
  uStack_80 = in_XMM5_Dc;
  uStack_7c = in_XMM5_Dd;
  uStack_94 = in_XMM4_Db;
  dw = sw;
  uStack_90 = in_XMM4_Dc;
  uStack_8c = in_XMM4_Dd;
  local_78 = (float *)CONCAT44(in_XMM3_Db,sy);
  local_68 = (float *)CONCAT44(in_XMM2_Db,sx);
  local_58._8_4_ = in_XMM1_Dc;
  local_58._0_8_ = tint._8_8_;
  local_58._12_4_ = in_XMM1_Dd;
  bitmap_00 = al_get_target_bitmap();
  pAVar6 = _al_get_bitmap_display(bitmap_00);
  bitmap_01 = bitmap_00->parent;
  if (bitmap_00->parent == (ALLEGRO_BITMAP *)0x0) {
    bitmap_01 = bitmap_00;
  }
  pvVar2 = bitmap_01->extra;
  uVar5 = al_get_bitmap_flags(bitmap);
  if (((((uVar5 & 1) == 0) && (bitmap->locked == false)) && (bitmap_01->locked == false)) &&
     (*(char *)((long)bitmap->extra + 0x38) == '\x01')) {
    pAVar7 = al_get_current_transform();
    _Var4 = _al_transform_is_translation(pAVar7,&xtrans,&ytrans);
    if (_Var4) {
      if (*(long *)((long)pvVar2 + 0x10) != 0) {
        _al_ogl_set_target_bitmap(pAVar6,bitmap);
      }
      fVar8 = (float)bitmap_01->cl;
      if (xtrans < fVar8) {
        local_68 = (float *)CONCAT44(local_68._4_4_,(float)local_68 - (xtrans - fVar8));
        dw = dw + (xtrans - fVar8);
        xtrans = fVar8;
      }
      fVar8 = (float)bitmap_01->ct;
      if (ytrans < fVar8) {
        local_78 = (float *)CONCAT44(local_78._4_4_,(float)local_78 - (ytrans - fVar8));
        dh = dh + (ytrans - fVar8);
        ytrans = fVar8;
      }
      uVar5 = -(uint)((float)bitmap_01->cr_excl < dw + xtrans);
      auVar16._0_4_ = (uint)((float)bitmap_01->cr_excl - xtrans) & uVar5;
      auVar16._4_4_ = auVar19._0_4_;
      auVar16._8_4_ = auVar19._4_4_;
      auVar16._12_4_ = auVar19._8_4_;
      auVar18._0_4_ = ~uVar5 & (uint)dw;
      auVar18._4_4_ = ~auVar19._0_4_ & uStack_94;
      auVar18._8_4_ = ~auVar19._4_4_ & uStack_90;
      auVar18._12_4_ = ~auVar19._8_4_ & uStack_8c;
      uVar5 = -(uint)((float)bitmap_01->cb_excl < dh + ytrans);
      auVar14._0_4_ = ~uVar5 & (uint)dh;
      auVar14._4_4_ = dh._4_4_;
      auVar14._8_4_ = dh._8_4_;
      auVar14._12_4_ = dh._12_4_;
      _dw = auVar14 | ZEXT416((uint)((float)bitmap_01->cb_excl - ytrans) & uVar5);
      _dh = auVar18 | auVar16;
      glBindTexture(0xde1,*(undefined4 *)((long)pvVar2 + 8));
      glCopyTexSubImage2D(0xde1,0,(int)xtrans,(int)(((float)bitmap_01->h - ytrans) - dw),
                          (int)(float)local_68,(int)(((float)bitmap->h - (float)local_78) - dw),
                          (int)dh,(int)dw);
      if (*(long *)((long)pvVar2 + 0x10) == 0) {
        return;
      }
      _al_ogl_set_target_bitmap(pAVar6,bitmap_01);
      return;
    }
  }
  auVar16 = local_58;
  if (pAVar6->ogl_extras->opengl_target == bitmap_01) {
    puVar3 = (undefined8 *)bitmap->extra;
    pAVar6 = al_get_current_display();
    if ((pAVar6->num_cache_vertices != 0) && (pAVar6->cache_texture != (ulong)*(uint *)(puVar3 + 1))
       ) {
      (*pAVar6->vt->flush_vertex_cache)(pAVar6);
    }
    pAVar6->cache_texture = (ulong)*(uint *)(puVar3 + 1);
    x = (float *)(*pAVar6->vt->prepare_vertex_cache)(pAVar6,6);
    iVar1 = bitmap->h;
    auVar9._0_4_ = ((float)bitmap->w - (float)local_68) - dw;
    fVar8 = *(float *)(puVar3 + 5);
    fVar17 = *(float *)((long)puVar3 + 0x34);
    *x = 0.0;
    x[1] = dh;
    x[2] = 0.0;
    auVar13._0_4_ = (float)(int)*puVar3;
    auVar13._4_4_ = (float)(int)((ulong)*puVar3 >> 0x20);
    auVar13._8_8_ = 0;
    auVar15._4_4_ = ((float)iVar1 - (float)local_78) - dh;
    auVar15._0_4_ = (float)local_68;
    auVar15._8_4_ = local_68._4_4_;
    auVar15._12_4_ = 0;
    auVar16 = divps(auVar15,auVar13);
    fVar8 = auVar16._0_4_ + fVar8;
    fVar17 = auVar16._4_4_ + fVar17;
    fVar20 = local_58._0_4_;
    fVar21 = local_58._4_4_;
    x[5] = (float)local_48;
    x[6] = local_48._4_4_;
    x[7] = fVar20;
    x[8] = fVar21;
    x[0xb] = 0.0;
    x[0xc] = fVar8;
    x[0xe] = (float)local_48;
    x[0xf] = local_48._4_4_;
    x[0x10] = fVar20;
    x[0x11] = fVar21;
    x[0x12] = dw;
    x[0x13] = dh;
    x[0x14] = 0.0;
    x[0x16] = fVar17;
    x[0x17] = (float)local_48;
    x[0x18] = local_48._4_4_;
    x[0x19] = fVar20;
    x[0x1a] = fVar21;
    x[0x24] = dw;
    auVar10._4_8_ = 0;
    auVar10._0_4_ = auVar9._0_4_;
    auVar10._12_4_ = local_78._4_4_;
    auVar9._8_8_ = auVar10._8_8_;
    auVar9._4_4_ = (float)local_78;
    auVar16 = divps(auVar9,auVar13);
    fVar11 = (float)((ulong)*(undefined8 *)((long)puVar3 + 0x2c) >> 0x20) - auVar16._0_4_;
    fVar12 = (float)*(undefined8 *)((long)puVar3 + 0x2c) - auVar16._4_4_;
    *(ulong *)(x + 3) = CONCAT44(fVar17,fVar8);
    x[9] = 0.0;
    x[10] = 0.0;
    x[0xd] = fVar12;
    x[0x15] = fVar11;
    x[0x25] = 0.0;
    x[0x26] = 0.0;
    *(ulong *)(x + 0x27) = CONCAT44(fVar12,fVar11);
    x[0x29] = (float)local_48;
    x[0x2a] = local_48._4_4_;
    x[0x2b] = fVar20;
    x[0x2c] = fVar21;
    if (pAVar6->cache_enabled == true) {
      local_38 = x + 1;
      local_58._0_8_ = x + 0xb;
      _dw = x + 0x13;
      local_48 = x + 0x14;
      local_78 = x + 0x24;
      local_68 = x + 0x25;
      _dh = x + 0x26;
      pAVar7 = al_get_current_transform();
      al_transform_coordinates_3d(pAVar7,x,local_38,x + 2);
      pAVar7 = al_get_current_transform();
      al_transform_coordinates_3d(pAVar7,x + 9,x + 10,(float *)local_58._0_8_);
      pAVar7 = al_get_current_transform();
      al_transform_coordinates_3d(pAVar7,x + 0x12,_dw,local_48);
      pAVar7 = al_get_current_transform();
      al_transform_coordinates_3d(pAVar7,local_78,local_68,_dh);
    }
    x[0x23] = x[0x11];
    *(undefined8 *)(x + 0x1f) = *(undefined8 *)(x + 0xd);
    *(undefined8 *)(x + 0x21) = *(undefined8 *)(x + 0xf);
    *(undefined8 *)(x + 0x1b) = *(undefined8 *)(x + 9);
    *(undefined8 *)(x + 0x1d) = *(undefined8 *)(x + 0xb);
    x[0x35] = x[0x1a];
    x[0x31] = x[0x16];
    x[0x32] = x[0x17];
    x[0x33] = x[0x18];
    x[0x34] = x[0x19];
    *(undefined8 *)(x + 0x2d) = *(undefined8 *)(x + 0x12);
    *(undefined8 *)(x + 0x2f) = *(undefined8 *)(x + 0x14);
    if (pAVar6->cache_enabled == false) {
      (*pAVar6->vt->flush_vertex_cache)(pAVar6);
    }
  }
  else {
    tint_00.b = (float)local_58._0_4_;
    tint_00.a = (float)local_58._4_4_;
    tint_00._0_8_ = local_48;
    local_58 = auVar16;
    _al_draw_bitmap_region_memory
              (bitmap,tint_00,(int)(float)local_68,(int)(float)local_78,(int)dw,(int)dh,0,0,flags);
  }
  return;
}

Assistant:

static void ogl_draw_bitmap_region(ALLEGRO_BITMAP *bitmap,
   ALLEGRO_COLOR tint, float sx, float sy,
   float sw, float sh, int flags)
{
   // FIXME: hack
   // FIXME: need format conversion if they don't match
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_target;
   ALLEGRO_DISPLAY *disp = _al_get_bitmap_display(target);

   /* For sub-bitmaps */
   if (target->parent) {
      target = target->parent;
   }

   ogl_target = target->extra;

   if (!(al_get_bitmap_flags(bitmap) & ALLEGRO_MEMORY_BITMAP) && !bitmap->locked &&
         !target->locked) {
      ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_source = bitmap->extra;
      if (ogl_source->is_backbuffer) {
         /* Our source bitmap is the OpenGL backbuffer, the target
          * is an OpenGL texture.
          */
         float xtrans, ytrans;

         /* Source and target cannot both be the back-buffer. */
         ASSERT(!ogl_target->is_backbuffer);

         /* If we only translate, we can do this fast. */
         if (_al_transform_is_translation(al_get_current_transform(),
            &xtrans, &ytrans)) {
            /* In general, we can't modify the texture while it's
             * FBO bound - so we temporarily disable the FBO.
             */
            if (ogl_target->fbo_info)
               _al_ogl_set_target_bitmap(disp, bitmap);
            
            /* We need to do clipping because glCopyTexSubImage2D
             * fails otherwise.
             */
            if (xtrans < target->cl) {
               sx -= xtrans - target->cl;
               sw += xtrans - target->cl;
               xtrans = target->cl;
            }
            if (ytrans < target->ct) {
               sy -= ytrans - target->ct;
               sh += ytrans - target->ct;
               ytrans = target->ct;
            }
            if (xtrans + sw > target->cr_excl) {
               sw = target->cr_excl - xtrans;
            }
            if (ytrans + sh > target->cb_excl) {
               sh = target->cb_excl - ytrans;
            }

            /* Note: Allegro 5.0.0 does not support blending or
             * tinting if the source bitmap is the screen. So it is
             * correct to ignore them here.
             */

            glBindTexture(GL_TEXTURE_2D, ogl_target->texture);
            glCopyTexSubImage2D(GL_TEXTURE_2D, 0,
                xtrans, target->h - ytrans - sh,
                sx, bitmap->h - sy - sh,
                sw, sh);
            /* Fix up FBO again after the copy. */
            if (ogl_target->fbo_info)
               _al_ogl_set_target_bitmap(disp, target);
            return;
         }
         
         /* Drawing a deformed backbuffer is not supported. */
         ASSERT(0);
      }
   }
   if (disp->ogl_extras->opengl_target == target) {
      draw_quad(bitmap, tint, sx, sy, sw, sh, flags);
      return;
   }

   /* If all else fails, fall back to software implementation. */
   _al_draw_bitmap_region_memory(bitmap, tint, sx, sy, sw, sh, 0, 0, flags);
}